

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableBeginApplyRequests(ImGuiTable *table)

{
  char *pcVar1;
  float width;
  char cVar2;
  char cVar3;
  ImGuiTableColumn *pIVar4;
  int iVar5;
  ImGuiTableColumn *pIVar6;
  long lVar7;
  long lVar8;
  char *pcVar9;
  ImGuiTableColumnIdx *pIVar10;
  ImGuiTableColumn *pIVar11;
  ImGuiTableColumn *pIVar12;
  char cVar13;
  long lVar14;
  
  if (table->InstanceCurrent != 0) goto LAB_001d485a;
  cVar13 = table->ResizedColumn;
  if (cVar13 == -1) {
    cVar13 = -1;
  }
  else {
    width = table->ResizedColumnNextWidth;
    if ((width != 3.4028235e+38) || (NAN(width))) {
      TableSetColumnWidth((int)cVar13,width);
      cVar13 = table->ResizedColumn;
    }
  }
  table->LastResizedColumn = cVar13;
  table->ResizedColumnNextWidth = 3.4028235e+38;
  table->ResizedColumn = -1;
  cVar13 = table->AutoFitSingleColumn;
  if ((long)cVar13 == -1) {
LAB_001d4850:
    if (table->InstanceCurrent != 0) {
LAB_001d485a:
      if (table->IsResetDisplayOrderRequest == true) {
        if (0 < table->ColumnsCount) {
          lVar7 = 0;
          lVar8 = 0;
          do {
            pIVar6 = (table->Columns).Data;
            if ((table->Columns).DataEnd <= (ImGuiTableColumn *)((long)&pIVar6->Flags + lVar7))
            goto LAB_001d4a2a;
            (&pIVar6->DisplayOrder)[lVar7] = (ImGuiTableColumnIdx)lVar8;
            pIVar10 = (table->DisplayOrderToIndex).Data + lVar8;
            if ((table->DisplayOrderToIndex).DataEnd <= pIVar10) goto LAB_001d4a41;
            *pIVar10 = (ImGuiTableColumnIdx)lVar8;
            lVar8 = lVar8 + 1;
            lVar7 = lVar7 + 0x68;
          } while (lVar8 < table->ColumnsCount);
        }
        table->IsResetDisplayOrderRequest = false;
        table->IsSettingsDirty = true;
      }
      return;
    }
    cVar13 = table->ReorderColumn;
    if (table->HeldHeaderColumn == -1) {
      if (cVar13 != -1) {
        table->ReorderColumn = -1;
      }
      table->HeldHeaderColumn = -1;
      goto LAB_001d485a;
    }
    table->HeldHeaderColumn = -1;
    if (cVar13 == -1) goto LAB_001d485a;
    cVar2 = table->ReorderColumnDir;
    iVar5 = (int)cVar2;
    if (iVar5 == 0) goto LAB_001d485a;
    if ((cVar2 != '\x01') && (cVar2 != -1)) {
      __assert_fail("reorder_dir == -1 || reorder_dir == +1",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_tables.cpp"
                    ,0x270,"void ImGui::TableBeginApplyRequests(ImGuiTable *)");
    }
    if ((table->Flags & 2) == 0) {
      __assert_fail("table->Flags & ImGuiTableFlags_Reorderable",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_tables.cpp"
                    ,0x271,"void ImGui::TableBeginApplyRequests(ImGuiTable *)");
    }
    if (-1 < cVar13) {
      pIVar6 = (table->Columns).Data;
      pIVar4 = (table->Columns).DataEnd;
      pIVar12 = pIVar6 + cVar13;
      if (((pIVar12 < pIVar4) &&
          (lVar7 = (long)*(char *)((long)&pIVar12->Flags + ((ulong)(cVar2 == -1) ^ 0x55)),
          -1 < lVar7)) && (pIVar11 = pIVar6 + lVar7, pIVar11 < pIVar4)) {
        cVar13 = pIVar12->DisplayOrder;
        cVar3 = pIVar11->DisplayOrder;
        pIVar12->DisplayOrder = cVar3;
        if (cVar13 != cVar3) {
          lVar8 = (long)cVar13;
          pcVar9 = (table->DisplayOrderToIndex).Data;
          lVar7 = lVar8;
          do {
            lVar7 = lVar7 + iVar5;
            if ((lVar7 < 0) ||
               (pcVar1 = pcVar9 + lVar7, (table->DisplayOrderToIndex).DataEnd <= pcVar1))
            goto LAB_001d4a41;
            lVar14 = (long)*pcVar1;
            if ((lVar14 < 0) || ((table->Columns).DataEnd <= pIVar6 + lVar14)) goto LAB_001d4a2a;
            pIVar10 = &pIVar6[lVar14].DisplayOrder;
            *pIVar10 = *pIVar10 - cVar2;
            lVar8 = lVar8 + iVar5;
          } while ((int)lVar8 != (int)cVar3);
          cVar13 = pIVar11->DisplayOrder;
        }
        if (cVar3 - iVar5 != (int)cVar13) {
          __assert_fail("dst_column->DisplayOrder == dst_order - reorder_dir",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_tables.cpp"
                        ,0x27a,"void ImGui::TableBeginApplyRequests(ImGuiTable *)");
        }
        if (0 < table->ColumnsCount) {
          lVar7 = 0;
          lVar8 = 0;
          do {
            pIVar6 = (table->Columns).Data;
            if ((table->Columns).DataEnd <= (ImGuiTableColumn *)((long)&pIVar6->Flags + lVar7))
            goto LAB_001d4a2a;
            lVar14 = (long)(&pIVar6->DisplayOrder)[lVar7];
            if ((lVar14 < 0) ||
               (pcVar9 = (table->DisplayOrderToIndex).Data + lVar14,
               (table->DisplayOrderToIndex).DataEnd <= pcVar9)) goto LAB_001d4a41;
            *pcVar9 = (char)lVar8;
            lVar8 = lVar8 + 1;
            lVar7 = lVar7 + 0x68;
          } while (lVar8 < table->ColumnsCount);
        }
        table->ReorderColumnDir = '\0';
        table->IsSettingsDirty = true;
        goto LAB_001d485a;
      }
    }
  }
  else if ((-1 < cVar13) &&
          (pIVar6 = (table->Columns).Data + cVar13, pIVar6 < (table->Columns).DataEnd)) {
    TableSetColumnWidth((int)cVar13,pIVar6->WidthAuto);
    table->AutoFitSingleColumn = -1;
    goto LAB_001d4850;
  }
LAB_001d4a2a:
  pcVar9 = "T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]";
LAB_001d4a56:
  __assert_fail("p >= Data && p < DataEnd",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_internal.h"
                ,0x24a,pcVar9);
LAB_001d4a41:
  pcVar9 = "T &ImSpan<signed char>::operator[](int) [T = signed char]";
  goto LAB_001d4a56;
}

Assistant:

void ImGui::TableBeginApplyRequests(ImGuiTable* table)
{
    // Handle resizing request
    // (We process this at the first TableBegin of the frame)
    // FIXME-TABLE: Contains columns if our work area doesn't allow for scrolling?
    if (table->InstanceCurrent == 0)
    {
        if (table->ResizedColumn != -1 && table->ResizedColumnNextWidth != FLT_MAX)
            TableSetColumnWidth(table->ResizedColumn, table->ResizedColumnNextWidth);
        table->LastResizedColumn = table->ResizedColumn;
        table->ResizedColumnNextWidth = FLT_MAX;
        table->ResizedColumn = -1;

        // Process auto-fit for single column, which is a special case for stretch columns and fixed columns with FixedSame policy.
        // FIXME-TABLE: Would be nice to redistribute available stretch space accordingly to other weights, instead of giving it all to siblings.
        if (table->AutoFitSingleColumn != -1)
        {
            TableSetColumnWidth(table->AutoFitSingleColumn, table->Columns[table->AutoFitSingleColumn].WidthAuto);
            table->AutoFitSingleColumn = -1;
        }
    }

    // Handle reordering request
    // Note: we don't clear ReorderColumn after handling the request.
    if (table->InstanceCurrent == 0)
    {
        if (table->HeldHeaderColumn == -1 && table->ReorderColumn != -1)
            table->ReorderColumn = -1;
        table->HeldHeaderColumn = -1;
        if (table->ReorderColumn != -1 && table->ReorderColumnDir != 0)
        {
            // We need to handle reordering across hidden columns.
            // In the configuration below, moving C to the right of E will lead to:
            //    ... C [D] E  --->  ... [D] E  C   (Column name/index)
            //    ... 2  3  4        ...  2  3  4   (Display order)
            const int reorder_dir = table->ReorderColumnDir;
            IM_ASSERT(reorder_dir == -1 || reorder_dir == +1);
            IM_ASSERT(table->Flags & ImGuiTableFlags_Reorderable);
            ImGuiTableColumn* src_column = &table->Columns[table->ReorderColumn];
            ImGuiTableColumn* dst_column = &table->Columns[(reorder_dir == -1) ? src_column->PrevEnabledColumn : src_column->NextEnabledColumn];
            IM_UNUSED(dst_column);
            const int src_order = src_column->DisplayOrder;
            const int dst_order = dst_column->DisplayOrder;
            src_column->DisplayOrder = (ImGuiTableColumnIdx)dst_order;
            for (int order_n = src_order + reorder_dir; order_n != dst_order + reorder_dir; order_n += reorder_dir)
                table->Columns[table->DisplayOrderToIndex[order_n]].DisplayOrder -= (ImGuiTableColumnIdx)reorder_dir;
            IM_ASSERT(dst_column->DisplayOrder == dst_order - reorder_dir);

            // Display order is stored in both columns->IndexDisplayOrder and table->DisplayOrder[],
            // rebuild the later from the former.
            for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                table->DisplayOrderToIndex[table->Columns[column_n].DisplayOrder] = (ImGuiTableColumnIdx)column_n;
            table->ReorderColumnDir = 0;
            table->IsSettingsDirty = true;
        }
    }

    // Handle display order reset request
    if (table->IsResetDisplayOrderRequest)
    {
        for (int n = 0; n < table->ColumnsCount; n++)
            table->DisplayOrderToIndex[n] = table->Columns[n].DisplayOrder = (ImGuiTableColumnIdx)n;
        table->IsResetDisplayOrderRequest = false;
        table->IsSettingsDirty = true;
    }
}